

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O3

void kernel::RemoveCoinHash(MuHash3072 *muhash,COutPoint *outpoint,Coin *coin)

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> in;
  DataStream local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_read_pos = 0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  TxOutSer<DataStream>(&local_38,outpoint,coin);
  in.m_data = local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
              _M_impl.super__Vector_impl_data._M_start + local_38.m_read_pos;
  in.m_size = (long)local_38.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)in.m_data;
  MuHash3072::Remove(muhash,in);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RemoveCoinHash(MuHash3072& muhash, const COutPoint& outpoint, const Coin& coin)
{
    DataStream ss{};
    TxOutSer(ss, outpoint, coin);
    muhash.Remove(MakeUCharSpan(ss));
}